

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O0

void __thiscall
ELFIO::section_impl<ELFIO::Elf32_Shdr>::append_data
          (section_impl<ELFIO::Elf32_Shdr> *this,char *raw_data,Elf_Word size)

{
  char *__first;
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  bad_alloc *anon_var_0;
  char *new_data;
  Elf_Word size_local;
  char *raw_data_local;
  section_impl<ELFIO::Elf32_Shdr> *this_local;
  
  iVar2 = (*(this->super_section)._vptr_section[5])();
  if (iVar2 != 8) {
    iVar2 = (*(this->super_section)._vptr_section[0x13])();
    if (CONCAT44(extraout_var,iVar2) + (ulong)size < (ulong)this->data_size) {
      pcVar3 = this->data;
      iVar2 = (*(this->super_section)._vptr_section[0x13])();
      std::copy<char_const*,char*>
                (raw_data,raw_data + size,pcVar3 + CONCAT44(extraout_var_00,iVar2));
    }
    else {
      this->data_size = (this->data_size + size) * 2;
      pcVar3 = (char *)operator_new__((ulong)this->data_size);
      if (pcVar3 != (char *)0x0) {
        __first = this->data;
        pcVar1 = this->data;
        iVar2 = (*(this->super_section)._vptr_section[0x13])();
        std::copy<char*,char*>(__first,pcVar1 + CONCAT44(extraout_var_01,iVar2),pcVar3);
        iVar2 = (*(this->super_section)._vptr_section[0x13])();
        std::copy<char_const*,char*>
                  (raw_data,raw_data + size,pcVar3 + CONCAT44(extraout_var_02,iVar2));
        if (this->data != (char *)0x0) {
          operator_delete__(this->data);
        }
        this->data = pcVar3;
      }
    }
    iVar2 = (*(this->super_section)._vptr_section[0x13])();
    (*(this->super_section)._vptr_section[0x14])(this,CONCAT44(extraout_var_03,iVar2) + (ulong)size)
    ;
  }
  return;
}

Assistant:

void
    append_data( const char* raw_data, Elf_Word size )
    {
        if ( get_type() != SHT_NOBITS ) {
            if ( get_size() + size < data_size ) {
                std::copy( raw_data, raw_data + size, data + get_size() );
            }
            else {
                data_size = 2*( data_size + size);
                char* new_data;
                try {
                    new_data = new char[data_size];
                } catch (const std::bad_alloc&) {
                    new_data = 0;
                    size     = 0;
                }
                if ( 0 != new_data ) {
                    std::copy( data, data + get_size(), new_data );
                    std::copy( raw_data, raw_data + size, new_data + get_size() );
                    delete [] data;
                    data = new_data;
                }
            }
            set_size( get_size() + size );
        }
    }